

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

bool __thiscall Board::suited_capabilities_met(Board *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  mapped_type *ppvVar3;
  _Base_ptr p_Var4;
  SuitPlayCapability capability;
  int player_number;
  Hand hand;
  SuitPlayCapability local_68;
  _Rb_tree_color local_64;
  _Vector_base<Card,_std::allocator<Card>_> local_60;
  _Vector_base<Card,_std::allocator<Card>_> local_48;
  
  p_Var1 = &(this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_64 = p_Var4[1]._M_color;
    local_68.m_can_play_spades = (bool)p_Var4[1].field_0x4;
    local_68.m_can_play_hearts = (bool)p_Var4[1].field_0x5;
    local_68.m_can_play_diamonds = (bool)p_Var4[1].field_0x6;
    local_68.m_can_play_clubs = (bool)p_Var4[1].field_0x7;
    ppvVar3 = std::
              map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
              ::operator[](&this->m_player_hands,(key_type *)&local_64);
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)&local_48,*ppvVar3);
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)&local_60,
               (vector<Card,_std::allocator<Card>_> *)&local_48);
    bVar2 = SuitPlayCapability::are_capabilities_broken
                      (&local_68,(vector<Card,_std::allocator<Card>_> *)&local_60);
    std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_60);
    std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_48);
    if (bVar2) break;
  }
  return (_Rb_tree_header *)p_Var4 == p_Var1;
}

Assistant:

bool Board::suited_capabilities_met()
{
    for(auto const &pair : m_player_suited_capabilities) {
        int player_number = pair.first;
        SuitPlayCapability capability = pair.second;
        Hand hand = *m_player_hands[player_number];
        if(capability.are_capabilities_broken(hand)) {
            return false;
        }
    }
    return true;
}